

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_MacroArgs_EvaluateOnceBool::Run(void)

{
  char *pcVar1;
  FlagSettingMode in_R8D;
  FlagSaver fs;
  string local_28;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","MacroArgs","EvaluateOnceBool");
  if (fLB::FLAGS_changeable_bool_var == '\0') {
    pcVar1 = "FLAGS_changeable_bool_var";
  }
  else {
    if (changeable_bool_var != 0x1f49) {
      fprintf(_stderr,"Check failed: %s %s %s\n","8009","==","changeable_bool_var");
      goto LAB_00120daa;
    }
    SetCommandLineOptionWithMode_abi_cxx11_(&local_28,(gflags *)0x14f9c6,"false",(char *)0x1,in_R8D)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (fLB::FLAGS_changeable_bool_var != '\x01') {
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    pcVar1 = "!(FLAGS_changeable_bool_var)";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar1);
LAB_00120daa:
  exit(1);
}

Assistant:

TEST(MacroArgs, EvaluateOnceBool) {
  EXPECT_TRUE(FLAGS_changeable_bool_var);
  EXPECT_TRUE(FLAGS_changeable_bool_var);
  EXPECT_EQ(8009, changeable_bool_var);
  SetCommandLineOptionWithMode("changeable_bool_var", "false",
                               SET_FLAG_IF_DEFAULT);
  EXPECT_FALSE(FLAGS_changeable_bool_var);
}